

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fMultisampleTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::MultisampleTests::init(MultisampleTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestNode *node;
  TestNode *pTVar2;
  CommonEdgeCase *pCVar3;
  MaskProportionalityCase *pMVar4;
  MaskConstancyCase *pMVar5;
  char *description;
  char *name;
  int numFboSamples;
  int iVar6;
  
  iVar6 = 0;
  do {
    if (iVar6 == 0) {
      numFboSamples = -1;
    }
    else if (iVar6 == 1) {
      numFboSamples = 4;
    }
    else if (iVar6 == 2) {
      numFboSamples = 8;
    }
    else {
      numFboSamples = (uint)(iVar6 == 3) * 2 + -2;
    }
    node = (TestNode *)operator_new(0x78);
    name = "default_framebuffer";
    if ((iVar6 != 0) && (name = "fbo_4_samples", iVar6 != 1)) {
      if (iVar6 == 2) {
        name = "fbo_8_samples";
      }
      else {
        name = (char *)0x0;
        if (iVar6 == 3) {
          name = "fbo_max_samples";
        }
      }
    }
    pCVar1 = (this->super_TestCaseGroup).m_context;
    description = "Render into default framebuffer";
    if ((iVar6 != 0) &&
       (description = "Render into a framebuffer object with 4 samples", iVar6 != 1)) {
      if (iVar6 == 2) {
        description = "Render into a framebuffer object with 8 samples";
      }
      else {
        description = (char *)0x0;
        if (iVar6 == 3) {
          description = "Render into a framebuffer object with the maximum number of samples";
        }
      }
    }
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)node,pCVar1->m_testCtx,name,description);
    node->_vptr_TestNode = (_func_int **)&PTR__TestCase_0217f168;
    node[1]._vptr_TestNode = (_func_int **)pCVar1;
    tcu::TestNode::addChild((TestNode *)this,node);
    pTVar2 = (TestNode *)operator_new(0xf8);
    PolygonNumSamplesCase::PolygonNumSamplesCase
              ((PolygonNumSamplesCase *)pTVar2,(this->super_TestCaseGroup).m_context,
               "num_samples_polygon","Test sanity of the sample count, with polygons",numFboSamples)
    ;
    tcu::TestNode::addChild(node,pTVar2);
    pTVar2 = (TestNode *)operator_new(0xf8);
    LineNumSamplesCase::LineNumSamplesCase
              ((LineNumSamplesCase *)pTVar2,(this->super_TestCaseGroup).m_context,"num_samples_line"
               ,"Test sanity of the sample count, with lines",numFboSamples);
    tcu::TestNode::addChild(node,pTVar2);
    pCVar3 = (CommonEdgeCase *)operator_new(0xe8);
    CommonEdgeCase::CommonEdgeCase
              (pCVar3,(this->super_TestCaseGroup).m_context,"common_edge_small_quads",
               "Test polygons\' common edges with small quads",CASETYPE_SMALL_QUADS,numFboSamples);
    tcu::TestNode::addChild(node,(TestNode *)pCVar3);
    pCVar3 = (CommonEdgeCase *)operator_new(0xe8);
    CommonEdgeCase::CommonEdgeCase
              (pCVar3,(this->super_TestCaseGroup).m_context,"common_edge_big_quad",
               "Test polygons\' common edges with bigger-than-viewport quads",
               CASETYPE_BIGGER_THAN_VIEWPORT_QUAD,numFboSamples);
    tcu::TestNode::addChild(node,(TestNode *)pCVar3);
    pCVar3 = (CommonEdgeCase *)operator_new(0xe8);
    CommonEdgeCase::CommonEdgeCase
              (pCVar3,(this->super_TestCaseGroup).m_context,"common_edge_viewport_quad",
               "Test polygons\' common edges with exactly viewport-sized quads",
               CASETYPE_FIT_VIEWPORT_QUAD,numFboSamples);
    tcu::TestNode::addChild(node,(TestNode *)pCVar3);
    pTVar2 = (TestNode *)operator_new(0xf8);
    SampleDepthCase::SampleDepthCase
              ((SampleDepthCase *)pTVar2,(this->super_TestCaseGroup).m_context,"depth",
               "Test that depth values are per-sample",numFboSamples);
    tcu::TestNode::addChild(node,pTVar2);
    pTVar2 = (TestNode *)operator_new(0xd8);
    SampleStencilCase::SampleStencilCase
              ((SampleStencilCase *)pTVar2,(this->super_TestCaseGroup).m_context,"stencil",
               "Test that stencil values are per-sample",numFboSamples);
    tcu::TestNode::addChild(node,pTVar2);
    pTVar2 = (TestNode *)operator_new(0xd8);
    CoverageMaskInvertCase::CoverageMaskInvertCase
              ((CoverageMaskInvertCase *)pTVar2,(this->super_TestCaseGroup).m_context,
               "sample_coverage_invert",
               "Test that non-inverted and inverted sample coverage masks are each other\'s negations"
               ,numFboSamples);
    tcu::TestNode::addChild(node,pTVar2);
    pMVar4 = (MaskProportionalityCase *)operator_new(0xe8);
    MaskProportionalityCase::MaskProportionalityCase
              (pMVar4,(this->super_TestCaseGroup).m_context,"proportionality_alpha_to_coverage",
               "Test the proportionality property of GL_SAMPLE_ALPHA_TO_COVERAGE",
               CASETYPE_ALPHA_TO_COVERAGE,numFboSamples);
    tcu::TestNode::addChild(node,(TestNode *)pMVar4);
    pMVar4 = (MaskProportionalityCase *)operator_new(0xe8);
    MaskProportionalityCase::MaskProportionalityCase
              (pMVar4,(this->super_TestCaseGroup).m_context,"proportionality_sample_coverage",
               "Test the proportionality property of GL_SAMPLE_COVERAGE",CASETYPE_SAMPLE_COVERAGE,
               numFboSamples);
    tcu::TestNode::addChild(node,(TestNode *)pMVar4);
    pMVar4 = (MaskProportionalityCase *)operator_new(0xe8);
    MaskProportionalityCase::MaskProportionalityCase
              (pMVar4,(this->super_TestCaseGroup).m_context,
               "proportionality_sample_coverage_inverted",
               "Test the proportionality property of inverted-mask GL_SAMPLE_COVERAGE",
               CASETYPE_SAMPLE_COVERAGE_INVERTED,numFboSamples);
    tcu::TestNode::addChild(node,(TestNode *)pMVar4);
    pMVar5 = (MaskConstancyCase *)operator_new(0xe0);
    MaskConstancyCase::MaskConstancyCase
              (pMVar5,(this->super_TestCaseGroup).m_context,"constancy_alpha_to_coverage",
               "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE"
               ,CASETYPE_ALPHA_TO_COVERAGE,numFboSamples);
    tcu::TestNode::addChild(node,(TestNode *)pMVar5);
    pMVar5 = (MaskConstancyCase *)operator_new(0xe0);
    MaskConstancyCase::MaskConstancyCase
              (pMVar5,(this->super_TestCaseGroup).m_context,"constancy_sample_coverage",
               "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_COVERAGE"
               ,CASETYPE_SAMPLE_COVERAGE,numFboSamples);
    tcu::TestNode::addChild(node,(TestNode *)pMVar5);
    pMVar5 = (MaskConstancyCase *)operator_new(0xe0);
    MaskConstancyCase::MaskConstancyCase
              (pMVar5,(this->super_TestCaseGroup).m_context,"constancy_sample_coverage_inverted",
               "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using inverted-mask GL_SAMPLE_COVERAGE"
               ,CASETYPE_SAMPLE_COVERAGE_INVERTED,numFboSamples);
    tcu::TestNode::addChild(node,(TestNode *)pMVar5);
    pMVar5 = (MaskConstancyCase *)operator_new(0xe0);
    MaskConstancyCase::MaskConstancyCase
              (pMVar5,(this->super_TestCaseGroup).m_context,"constancy_both",
               "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE and GL_SAMPLE_COVERAGE"
               ,CASETYPE_BOTH,numFboSamples);
    tcu::TestNode::addChild(node,(TestNode *)pMVar5);
    pMVar5 = (MaskConstancyCase *)operator_new(0xe0);
    MaskConstancyCase::MaskConstancyCase
              (pMVar5,(this->super_TestCaseGroup).m_context,"constancy_both_inverted",
               "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE and inverted-mask GL_SAMPLE_COVERAGE"
               ,CASETYPE_BOTH_INVERTED,numFboSamples);
    tcu::TestNode::addChild(node,(TestNode *)pMVar5);
    iVar6 = iVar6 + 1;
  } while (iVar6 != 4);
  return extraout_EAX;
}

Assistant:

void MultisampleTests::init (void)
{
	enum CaseType
	{
		CASETYPE_DEFAULT_FRAMEBUFFER = 0,
		CASETYPE_FBO_4_SAMPLES,
		CASETYPE_FBO_8_SAMPLES,
		CASETYPE_FBO_MAX_SAMPLES,

		CASETYPE_LAST
	};

	for (int caseTypeI = 0; caseTypeI < (int)CASETYPE_LAST; caseTypeI++)
	{
		CaseType		caseType		= (CaseType)caseTypeI;
		int				numFboSamples	= caseType == CASETYPE_DEFAULT_FRAMEBUFFER	? -1
										: caseType == CASETYPE_FBO_4_SAMPLES		? 4
										: caseType == CASETYPE_FBO_8_SAMPLES		? 8
										: caseType == CASETYPE_FBO_MAX_SAMPLES		? 0
										: -2;

		TestCaseGroup*	group			= new TestCaseGroup(m_context,
															caseType == CASETYPE_DEFAULT_FRAMEBUFFER	? "default_framebuffer" :
															caseType == CASETYPE_FBO_4_SAMPLES			? "fbo_4_samples" :
															caseType == CASETYPE_FBO_8_SAMPLES			? "fbo_8_samples" :
															caseType == CASETYPE_FBO_MAX_SAMPLES		? "fbo_max_samples" :
															DE_NULL,
															caseType == CASETYPE_DEFAULT_FRAMEBUFFER	? "Render into default framebuffer" :
															caseType == CASETYPE_FBO_4_SAMPLES			? "Render into a framebuffer object with 4 samples" :
															caseType == CASETYPE_FBO_8_SAMPLES			? "Render into a framebuffer object with 8 samples" :
															caseType == CASETYPE_FBO_MAX_SAMPLES		? "Render into a framebuffer object with the maximum number of samples" :
															DE_NULL);
		DE_ASSERT(group->getName() != DE_NULL);
		DE_ASSERT(group->getDescription() != DE_NULL);
		DE_ASSERT(numFboSamples >= -1);
		addChild(group);

		group->addChild(new PolygonNumSamplesCase		(m_context, "num_samples_polygon",			"Test sanity of the sample count, with polygons",										numFboSamples));
		group->addChild(new LineNumSamplesCase			(m_context, "num_samples_line",				"Test sanity of the sample count, with lines",											numFboSamples));
		group->addChild(new CommonEdgeCase				(m_context, "common_edge_small_quads",		"Test polygons' common edges with small quads",											CommonEdgeCase::CASETYPE_SMALL_QUADS,				numFboSamples));
		group->addChild(new CommonEdgeCase				(m_context, "common_edge_big_quad",			"Test polygons' common edges with bigger-than-viewport quads",							CommonEdgeCase::CASETYPE_BIGGER_THAN_VIEWPORT_QUAD,	numFboSamples));
		group->addChild(new CommonEdgeCase				(m_context, "common_edge_viewport_quad",	"Test polygons' common edges with exactly viewport-sized quads",						CommonEdgeCase::CASETYPE_FIT_VIEWPORT_QUAD,			numFboSamples));
		group->addChild(new SampleDepthCase				(m_context, "depth",						"Test that depth values are per-sample",												numFboSamples));
		group->addChild(new SampleStencilCase			(m_context, "stencil",						"Test that stencil values are per-sample",												numFboSamples));
		group->addChild(new CoverageMaskInvertCase		(m_context, "sample_coverage_invert",		"Test that non-inverted and inverted sample coverage masks are each other's negations",	numFboSamples));

		group->addChild(new MaskProportionalityCase		(m_context, "proportionality_alpha_to_coverage",
																	"Test the proportionality property of GL_SAMPLE_ALPHA_TO_COVERAGE",
																	MaskProportionalityCase::CASETYPE_ALPHA_TO_COVERAGE, numFboSamples));
		group->addChild(new MaskProportionalityCase		(m_context, "proportionality_sample_coverage",
																	"Test the proportionality property of GL_SAMPLE_COVERAGE",
																	MaskProportionalityCase::CASETYPE_SAMPLE_COVERAGE, numFboSamples));
		group->addChild(new MaskProportionalityCase		(m_context, "proportionality_sample_coverage_inverted",
																	"Test the proportionality property of inverted-mask GL_SAMPLE_COVERAGE",
																	MaskProportionalityCase::CASETYPE_SAMPLE_COVERAGE_INVERTED, numFboSamples));

		group->addChild(new MaskConstancyCase			(m_context, "constancy_alpha_to_coverage",
																	"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE",
																	MaskConstancyCase::CASETYPE_ALPHA_TO_COVERAGE, numFboSamples));
		group->addChild(new MaskConstancyCase			(m_context, "constancy_sample_coverage",
																	"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_COVERAGE",
																	MaskConstancyCase::CASETYPE_SAMPLE_COVERAGE, numFboSamples));
		group->addChild(new MaskConstancyCase			(m_context, "constancy_sample_coverage_inverted",
																	"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using inverted-mask GL_SAMPLE_COVERAGE",
																	MaskConstancyCase::CASETYPE_SAMPLE_COVERAGE_INVERTED, numFboSamples));
		group->addChild(new MaskConstancyCase			(m_context, "constancy_both",
																	"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE and GL_SAMPLE_COVERAGE",
																	MaskConstancyCase::CASETYPE_BOTH, numFboSamples));
		group->addChild(new MaskConstancyCase			(m_context, "constancy_both_inverted",
																	"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE and inverted-mask GL_SAMPLE_COVERAGE",
																	MaskConstancyCase::CASETYPE_BOTH_INVERTED, numFboSamples));
	}
}